

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

container_t *
container_ixor(container_t *c1,uint8_t type1,container_t *c2,uint8_t type2,uint8_t *result_type)

{
  undefined1 uVar1;
  _Bool _Var2;
  int iVar3;
  container_t *local_40;
  container_t *result;
  uint8_t *result_type_local;
  array_container_t *paStack_28;
  uint8_t type2_local;
  container_t *c2_local;
  array_container_t *paStack_18;
  uint8_t type1_local;
  container_t *c1_local;
  
  result = result_type;
  result_type_local._7_1_ = type2;
  paStack_28 = (array_container_t *)c2;
  c2_local._7_1_ = type1;
  paStack_18 = (array_container_t *)c1;
  paStack_18 = (array_container_t *)get_writable_copy_if_shared(c1,(uint8_t *)((long)&c2_local + 7))
  ;
  paStack_28 = (array_container_t *)
               container_unwrap_shared(paStack_28,(uint8_t *)((long)&result_type_local + 7));
  local_40 = (container_t *)0x0;
  switch((result_type_local._7_1_ - 5) + (uint)c2_local._7_1_ * 4) {
  case 0:
    _Var2 = bitset_bitset_container_ixor
                      ((bitset_container_t *)paStack_18,(bitset_container_t *)paStack_28,&local_40);
    uVar1 = 2;
    if (_Var2) {
      uVar1 = 1;
    }
    *(undefined1 *)result = uVar1;
    c1_local = local_40;
    break;
  case 1:
    _Var2 = bitset_array_container_ixor((bitset_container_t *)paStack_18,paStack_28,&local_40);
    uVar1 = 2;
    if (_Var2) {
      uVar1 = 1;
    }
    *(undefined1 *)result = uVar1;
    c1_local = local_40;
    break;
  case 2:
    _Var2 = bitset_run_container_ixor
                      ((bitset_container_t *)paStack_18,(run_container_t *)paStack_28,&local_40);
    uVar1 = 2;
    if (_Var2) {
      uVar1 = 1;
    }
    *(undefined1 *)result = uVar1;
    c1_local = local_40;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x16e4,
                  "container_t *container_ixor(container_t *, uint8_t, const container_t *, uint8_t, uint8_t *)"
                 );
  case 4:
    _Var2 = array_bitset_container_ixor(paStack_18,(bitset_container_t *)paStack_28,&local_40);
    uVar1 = 2;
    if (_Var2) {
      uVar1 = 1;
    }
    *(undefined1 *)result = uVar1;
    c1_local = local_40;
    break;
  case 5:
    _Var2 = array_array_container_ixor(paStack_18,paStack_28,&local_40);
    uVar1 = 2;
    if (_Var2) {
      uVar1 = 1;
    }
    *(undefined1 *)result = uVar1;
    c1_local = local_40;
    break;
  case 6:
    iVar3 = array_run_container_ixor(paStack_18,(run_container_t *)paStack_28,&local_40);
    *(char *)result = (char)iVar3;
    c1_local = local_40;
    break;
  case 8:
    _Var2 = run_bitset_container_ixor
                      ((run_container_t *)paStack_18,(bitset_container_t *)paStack_28,&local_40);
    uVar1 = 2;
    if (_Var2) {
      uVar1 = 1;
    }
    *(undefined1 *)result = uVar1;
    c1_local = local_40;
    break;
  case 9:
    iVar3 = run_array_container_ixor((run_container_t *)paStack_18,paStack_28,&local_40);
    *(char *)result = (char)iVar3;
    c1_local = local_40;
    break;
  case 10:
    iVar3 = run_run_container_ixor
                      ((run_container_t *)paStack_18,(run_container_t *)paStack_28,&local_40);
    *(char *)result = (char)iVar3;
    c1_local = local_40;
  }
  return c1_local;
}

Assistant:

static inline container_t *container_ixor(
    container_t *c1, uint8_t type1,
    const container_t *c2, uint8_t type2,
    uint8_t *result_type
){
    c1 = get_writable_copy_if_shared(c1, &type1);
    c2 = container_unwrap_shared(c2, &type2);
    container_t *result = NULL;
    switch (PAIR_CONTAINER_TYPES(type1, type2)) {
        case CONTAINER_PAIR(BITSET,BITSET):
            *result_type = bitset_bitset_container_ixor(
                                CAST_bitset(c1), const_CAST_bitset(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,ARRAY):
            *result_type = array_array_container_ixor(
                                CAST_array(c1), const_CAST_array(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(RUN,RUN):
            *result_type = run_run_container_ixor(
                CAST_run(c1), const_CAST_run(c2), &result);
            return result;

        case CONTAINER_PAIR(BITSET,ARRAY):
            *result_type = bitset_array_container_ixor(
                                CAST_bitset(c1), const_CAST_array(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,BITSET):
            *result_type = array_bitset_container_ixor(
                                CAST_array(c1), const_CAST_bitset(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(BITSET,RUN):
            *result_type =
                bitset_run_container_ixor(
                    CAST_bitset(c1), const_CAST_run(c2), &result)
                        ? BITSET_CONTAINER_TYPE
                        : ARRAY_CONTAINER_TYPE;

            return result;

        case CONTAINER_PAIR(RUN,BITSET):
            *result_type = run_bitset_container_ixor(
                                CAST_run(c1), const_CAST_bitset(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,RUN):
            *result_type = array_run_container_ixor(
                                CAST_array(c1), const_CAST_run(c2), &result);
            return result;

        case CONTAINER_PAIR(RUN,ARRAY):
            *result_type = run_array_container_ixor(
                                CAST_run(c1), const_CAST_array(c2), &result);
            return result;

        default:
            assert(false);
            __builtin_unreachable();
            return NULL;
    }
}